

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yocto_obj.h
# Opt level: O2

yo__vert * yo__parse_vert(yo__vert *__return_storage_ptr__,char *str,yo__vhash *vhash,yo__vert vl)

{
  yo__vert *pyVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  yo__vert *pyVar5;
  int iVar6;
  char *pcVar7;
  int i_1;
  ulong uVar8;
  int i;
  long lVar9;
  long lVar10;
  yo__vert v;
  char *splits [5];
  
  splits[1] = (char *)0x0;
  splits[4] = (char *)0x0;
  splits[2] = (char *)0x0;
  splits[3] = (char *)0x0;
  splits[0] = str;
  v.pos = -1;
  v.texcoord = -1;
  v.norm = -1;
  v.color = -1;
  v.radius = -1;
  v.vid = 0;
  pcVar7 = str + 1;
  iVar2 = 1;
  do {
    if (pcVar7[-1] == '/') {
      pcVar7[-1] = '\0';
      if (iVar2 < 5) {
        lVar9 = (long)iVar2;
        iVar2 = iVar2 + 1;
        splits[lVar9] = pcVar7;
      }
    }
    else if (pcVar7[-1] == '\0') break;
    pcVar7 = pcVar7 + 1;
  } while( true );
  for (lVar9 = 0; lVar9 != 5; lVar9 = lVar9 + 1) {
    if (splits[lVar9] == (char *)0x0) {
      (&v.pos)[lVar9] = -1;
    }
    else {
      iVar2 = atoi(splits[lVar9]);
      if (iVar2 < 0) {
        iVar2 = iVar2 + (&vl.pos)[lVar9];
      }
      else {
        iVar2 = iVar2 + -1;
      }
      (&v.pos)[lVar9] = iVar2;
    }
  }
  iVar6 = v.pos % 0x100000;
  iVar2 = vhash->s[iVar6];
  lVar10 = (long)iVar2;
  uVar4 = 0xffffffffffffffff;
  lVar9 = 0x10;
  uVar8 = 0;
  while (((long)uVar8 < lVar10 && ((int)uVar4 < 0))) {
    pyVar5 = vhash->v[iVar6];
    if (((v.pos == *(int *)((long)pyVar5 + lVar9 + -0x10)) &&
        (((v.texcoord == *(int *)((long)pyVar5 + lVar9 + -0xc) &&
          (v.norm == *(int *)((long)pyVar5 + lVar9 + -8))) &&
         (v.color == *(int *)((long)pyVar5 + lVar9 + -4))))) &&
       (uVar4 = uVar4 & 0xffffffff, v.radius == *(int *)((long)&pyVar5->pos + lVar9))) {
      uVar4 = uVar8 & 0xffffffff;
    }
    uVar8 = uVar8 + 1;
    lVar9 = lVar9 + 0x18;
  }
  if (-1 < (int)uVar4) {
    pyVar5 = vhash->v[iVar6];
    pyVar1 = pyVar5 + (uVar4 & 0xffffffff);
    iVar2 = pyVar1->vid;
    __return_storage_ptr__->radius = pyVar1->radius;
    __return_storage_ptr__->vid = iVar2;
    pyVar5 = pyVar5 + (uVar4 & 0xffffffff);
    v.pos = pyVar5->pos;
    v.texcoord = pyVar5->texcoord;
    v.norm = pyVar5->norm;
    v.color = pyVar5->color;
    goto LAB_0016434c;
  }
  v.vid = vhash->nverts;
  if (iVar2 == 0) {
    pyVar5 = vhash->v[iVar6];
    iVar3 = yo__vector_capacity(1);
LAB_00164301:
    pyVar5 = (yo__vert *)realloc(pyVar5,(long)iVar3 * 0x18);
    vhash->v[iVar6] = pyVar5;
    lVar10 = (long)vhash->s[iVar6];
  }
  else {
    iVar3 = yo__vector_capacity(iVar2 + 1);
    iVar2 = yo__vector_capacity(iVar2);
    pyVar5 = vhash->v[iVar6];
    if (iVar2 < iVar3) goto LAB_00164301;
  }
  pyVar5[lVar10].radius = v.radius;
  pyVar5[lVar10].vid = v.vid;
  pyVar5 = pyVar5 + lVar10;
  pyVar5->pos = v.pos;
  pyVar5->texcoord = v.texcoord;
  pyVar5->norm = v.norm;
  pyVar5->color = v.color;
  vhash->s[iVar6] = vhash->s[iVar6] + 1;
  vhash->nverts = vhash->nverts + 1;
  __return_storage_ptr__->radius = v.radius;
  __return_storage_ptr__->vid = v.vid;
LAB_0016434c:
  __return_storage_ptr__->pos = v.pos;
  __return_storage_ptr__->texcoord = v.texcoord;
  __return_storage_ptr__->norm = v.norm;
  __return_storage_ptr__->color = v.color;
  return __return_storage_ptr__;
}

Assistant:

static inline yo__vert
yo__parse_vert(char* str, yo__vhash* vhash, yo__vert vl) {
    // parse triplet
    char* splits[] = { str, 0, 0, 0, 0 };
    int ns = 1;
    yo__vert v = { -1, -1, -1, -1, -1 };
    while (*str) {
        if (*str == '/') {
            *str = 0;
            if (ns < 5) splits[ns++] = str + 1;
        }
        str++;
    }
    int* f = &v.pos;
    int* l = &vl.pos;
    for (int i = 0; i < 5; i++) {
        if (!splits[i]) {
            f[i] = -1;
            continue;
        }
        f[i] = (int)atoi(splits[i]);
        f[i] = (f[i] < 0) ? l[i] + f[i] : f[i] - 1;
    }

    // determine position vid using vertex hash
    int pos = -1;
    int hidx = v.pos % yo__vhash_size;
    for (int i = 0; i < vhash->s[hidx] && pos < 0; i++) {
        if (v.pos == vhash->v[hidx][i].pos &&
            v.texcoord == vhash->v[hidx][i].texcoord &&
            v.norm == vhash->v[hidx][i].norm &&
            v.color == vhash->v[hidx][i].color &&
            v.radius == vhash->v[hidx][i].radius)
            pos = i;
    }

    // found, can exit
    if (pos >= 0) return vhash->v[hidx][pos];

    // insert in vhash
    v.vid = vhash->nverts;
    yo__pushback(yo__vert, vhash->v[hidx], vhash->s[hidx], v);
    vhash->nverts++;

    return v;
}